

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  Maze *pMVar3;
  allocator local_259;
  string local_258 [32];
  Maze *local_238;
  Maze *thePuzzle;
  undefined1 local_220 [8];
  ifstream MazeStream;
  char **argv_local;
  int argc_local;
  
  if (argc != 2) {
    poVar2 = std::operator<<((ostream *)&std::cout,"usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    std::operator<<(poVar2,
                    " inputFileNameThatContainsDictionary inputFileNameThatContainsPairsOfWords\n");
    exit(1);
  }
  std::ifstream::ifstream(local_220);
  std::ifstream::open(local_220,argv[1],8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Unable to open input file ->");
    poVar2 = std::operator<<(poVar2,argv[1]);
    std::operator<<(poVar2,"<-\n");
    exit(2);
  }
  std::ifstream::close();
  pMVar3 = (Maze *)operator_new(0x2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"sampleInputForMaze.txt",&local_259);
  Maze::Maze(pMVar3,(string *)local_258);
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  local_238 = pMVar3;
  Maze::pathBetweenCells(pMVar3);
  pMVar3 = local_238;
  if (local_238 != (Maze *)0x0) {
    Maze::~Maze(local_238);
    operator_delete(pMVar3,0x2b8);
  }
  std::ifstream::~ifstream(local_220);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) { // the main function.
    if( argc != 2) {
        std::cout << "usage: " << argv[0] << " inputFileNameThatContainsDictionary inputFileNameThatContainsPairsOfWords\n";
        exit(1);
    }
    std::ifstream MazeStream;
    MazeStream.open(argv[1]);
    if( !MazeStream.is_open()) {
        std::cout << "Unable to open input file ->" << argv[1] << "<-\n";
        exit(2);
    }
    MazeStream.close();

    Maze *thePuzzle = new Maze("sampleInputForMaze.txt");
    //thePuzzle->printMaze();
    //std::cout<<std::endl;
    thePuzzle->pathBetweenCells();
    delete thePuzzle;
}